

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall singleParticleSpectra::output_two_particle_correlation(singleParticleSpectra *this)

{
  char *pcVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  char *local_ab8 [4];
  ofstream output_os;
  undefined8 auStack_a90 [2];
  uint auStack_a80 [122];
  ofstream output_ss;
  undefined8 auStack_890 [2];
  uint auStack_880 [122];
  ofstream output;
  undefined8 auStack_690 [2];
  uint auStack_680 [122];
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
  if (this->rap_type == 0) {
    poVar2 = std::operator<<((ostream *)&filename,(string *)this);
    poVar2 = std::operator<<(poVar2,"/particle_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
    poVar2 = std::operator<<(poVar2,"_vn2");
    pcVar1 = "_Cmnk_os_eta_";
  }
  else {
    poVar2 = std::operator<<((ostream *)&filename,(string *)this);
    poVar2 = std::operator<<(poVar2,"/particle_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
    poVar2 = std::operator<<(poVar2,"_vn2");
    pcVar1 = "_Cmnk_os_y_";
  }
  std::operator<<(poVar2,pcVar1 + 8);
  poVar2 = std::ostream::_M_insert<double>(this->rap_min);
  std::operator<<(poVar2,"_");
  poVar2 = std::ostream::_M_insert<double>(this->rap_max);
  std::operator<<(poVar2,".dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output,_output_ss,_S_out);
  std::__cxx11::string::~string((string *)&output_ss);
  poVar2 = std::operator<<((ostream *)&output,
                           "# n  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar5 = (double)this->total_number_of_events;
  dVar6 = *(this->Qn2_vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar5;
  dVar4 = *(this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar5 - dVar6 * dVar6;
  local_ae0 = 0.0;
  if (0.0 < dVar4) {
    dVar4 = dVar4 / dVar5;
    if (dVar4 < 0.0) {
      local_ae0 = sqrt(dVar4);
    }
    else {
      local_ae0 = SQRT(dVar4);
    }
  }
  *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) =
       *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18) + 8) = 0x12;
  *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18)) = 8;
  poVar2 = (ostream *)std::ostream::operator<<(&output,0);
  std::operator<<(poVar2,"  ");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"  ");
  poVar2 = std::ostream::_M_insert<double>(local_ae0);
  std::operator<<(poVar2,"  ");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"  ");
  poVar2 = std::ostream::_M_insert<double>
                     (*(this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start /
                      (double)this->total_number_of_events);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar3 = 1; lVar3 < this->order_max; lVar3 = lVar3 + 1) {
    dVar4 = (this->Qn2_vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] / (double)this->total_number_of_events;
    local_ad0 = 0.0;
    local_ad8 = 0.0;
    if (0.0 < dVar4) {
      local_ad8 = dVar4 / dVar6;
      if (local_ad8 < 0.0) {
        local_ad8 = sqrt(local_ad8);
      }
      else {
        local_ad8 = SQRT(local_ad8);
      }
      dVar5 = (this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / (double)this->total_number_of_events -
              dVar4 * dVar4;
      local_ad0 = 0.0;
      if (0.0 < dVar5) {
        dVar5 = dVar5 / (double)this->total_number_of_events;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        local_ad0 = dVar5 / dVar6;
      }
    }
    *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) =
         *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18)) = 8;
    poVar2 = (ostream *)std::ostream::operator<<(&output,(int)lVar3);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(local_ad8);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(local_ad0);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>
                       ((this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3] /
                        (double)this->total_number_of_events);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::close();
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_ss);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_os);
    if (this->rap_type == 0) {
      poVar2 = std::operator<<((ostream *)&filename_ss,(string *)this);
      poVar2 = std::operator<<(poVar2,"/particle_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
      poVar2 = std::operator<<(poVar2,"_Cn2_ss");
      std::operator<<(poVar2,"_eta_");
      poVar2 = std::ostream::_M_insert<double>(this->rap_min);
      std::operator<<(poVar2,"_");
      poVar2 = std::ostream::_M_insert<double>(this->rap_max);
      std::operator<<(poVar2,".dat");
      poVar2 = std::operator<<((ostream *)&filename_os,(string *)this);
      poVar2 = std::operator<<(poVar2,"/particle_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
      poVar2 = std::operator<<(poVar2,"_Cn2_os");
      std::operator<<(poVar2,"_eta_");
      poVar2 = std::ostream::_M_insert<double>(this->rap_min);
      std::operator<<(poVar2,"_");
    }
    else {
      poVar2 = std::operator<<((ostream *)&filename_ss,(string *)this);
      poVar2 = std::operator<<(poVar2,"/particle_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
      poVar2 = std::operator<<(poVar2,"_Cn2_ss");
      std::operator<<(poVar2,"_y_");
      poVar2 = std::ostream::_M_insert<double>(this->rap_min);
      std::operator<<(poVar2,"_");
      poVar2 = std::ostream::_M_insert<double>(this->rap_max);
      std::operator<<(poVar2,".dat");
      poVar2 = std::operator<<((ostream *)&filename_os,(string *)this);
      poVar2 = std::operator<<(poVar2,"/particle_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
      poVar2 = std::operator<<(poVar2,"_Cn2_os");
      std::operator<<(poVar2,"_y_");
      poVar2 = std::ostream::_M_insert<double>(this->rap_min);
      std::operator<<(poVar2,"_");
    }
    poVar2 = std::ostream::_M_insert<double>(this->rap_max);
    std::operator<<(poVar2,".dat");
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_ss,_output_os,_S_out);
    std::__cxx11::string::~string((string *)&output_os);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_os,local_ab8[0],_S_out);
    std::__cxx11::string::~string((string *)local_ab8);
    poVar2 = std::operator<<((ostream *)&output_ss,"# n  vn{2}  vn{2}_err  Cn2_ss  Cn2_ss_err");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&output_os,"# n  vn{2}  vn{2}_err  Cn2_os  Cn2_os_err");
    std::endl<char,std::char_traits<char>>(poVar2);
    dVar5 = (double)this->total_number_of_events;
    dVar6 = *(this->Cn2_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar5;
    dVar4 = *(this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar5 - dVar6 * dVar6;
    local_ae0 = 0.0;
    if (0.0 < dVar4) {
      dVar4 = dVar4 / dVar5;
      if (dVar4 < 0.0) {
        local_ae0 = sqrt(dVar4);
      }
      else {
        local_ae0 = SQRT(dVar4);
      }
    }
    *(uint *)((long)auStack_880 + *(long *)(_output_ss + -0x18)) =
         *(uint *)((long)auStack_880 + *(long *)(_output_ss + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_890 + *(long *)(_output_ss + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_890 + *(long *)(_output_ss + -0x18)) = 8;
    poVar2 = (ostream *)std::ostream::operator<<(&output_ss,0);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(local_ae0);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>
                       (*(this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start /
                        (double)this->total_number_of_events);
    std::endl<char,std::char_traits<char>>(poVar2);
    dVar5 = (double)this->total_number_of_events;
    dVar7 = *(this->Cn2_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar5;
    dVar4 = *(this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar5 - dVar7 * dVar7;
    local_ae0 = 0.0;
    if (0.0 < dVar4) {
      dVar4 = dVar4 / dVar5;
      if (dVar4 < 0.0) {
        local_ae0 = sqrt(dVar4);
      }
      else {
        local_ae0 = SQRT(dVar4);
      }
    }
    *(uint *)((long)auStack_a80 + *(long *)(_output_os + -0x18)) =
         *(uint *)((long)auStack_a80 + *(long *)(_output_os + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_a90 + *(long *)(_output_os + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_a90 + *(long *)(_output_os + -0x18)) = 8;
    poVar2 = (ostream *)std::ostream::operator<<(&output_os,0);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(local_ae0);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>
                       (*(this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start /
                        (double)this->total_number_of_events);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar3 = 1; lVar3 < this->order_max; lVar3 = lVar3 + 1) {
      dVar4 = (this->Cn2_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / (double)this->total_number_of_events;
      local_ad0 = 0.0;
      local_ad8 = 0.0;
      if (0.0 < dVar4) {
        local_ad8 = dVar4 / dVar6;
        if (local_ad8 < 0.0) {
          local_ad8 = sqrt(local_ad8);
        }
        else {
          local_ad8 = SQRT(local_ad8);
        }
        dVar5 = (this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3] / (double)this->total_number_of_events -
                dVar4 * dVar4;
        local_ad0 = 0.0;
        if (0.0 < dVar5) {
          dVar5 = dVar5 / (double)this->total_number_of_events;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          local_ad0 = dVar5 / dVar6;
        }
      }
      *(uint *)((long)auStack_880 + *(long *)(_output_ss + -0x18)) =
           *(uint *)((long)auStack_880 + *(long *)(_output_ss + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_890 + *(long *)(_output_ss + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_890 + *(long *)(_output_ss + -0x18)) = 8;
      poVar2 = (ostream *)std::ostream::operator<<(&output_ss,(int)lVar3);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(local_ad8);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(local_ad0);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(dVar4);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar3] /
                          (double)this->total_number_of_events);
      std::endl<char,std::char_traits<char>>(poVar2);
      dVar4 = (this->Cn2_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3] / (double)this->total_number_of_events;
      local_ad0 = 0.0;
      local_ad8 = 0.0;
      if (0.0 < dVar4) {
        local_ad8 = dVar4 / dVar7;
        if (local_ad8 < 0.0) {
          local_ad8 = sqrt(local_ad8);
        }
        else {
          local_ad8 = SQRT(local_ad8);
        }
        dVar5 = (this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3] / (double)this->total_number_of_events -
                dVar4 * dVar4;
        local_ad0 = 0.0;
        if (0.0 < dVar5) {
          dVar5 = dVar5 / (double)this->total_number_of_events;
          if (dVar5 < 0.0) {
            dVar5 = sqrt(dVar5);
          }
          else {
            dVar5 = SQRT(dVar5);
          }
          local_ad0 = dVar5 / dVar7;
        }
      }
      *(uint *)((long)auStack_a80 + *(long *)(_output_os + -0x18)) =
           *(uint *)((long)auStack_a80 + *(long *)(_output_os + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_a90 + *(long *)(_output_os + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_a90 + *(long *)(_output_os + -0x18)) = 8;
      poVar2 = (ostream *)std::ostream::operator<<(&output_os,(int)lVar3);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(local_ad8);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(local_ad0);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>(dVar4);
      std::operator<<(poVar2,"  ");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar3] /
                          (double)this->total_number_of_events);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(&output_os);
    std::ofstream::~ofstream(&output_ss);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_os);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_ss);
  }
  std::ofstream::~ofstream(&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_vn2"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_vn2"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>" << endl;

    double num_pair = Qn2_vector[0] / total_number_of_events;
    double num_pair_stdsq =
        (Qn2_vector_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << "  " << num_pair << "  "
           << Qn2_vector_err[0] / total_number_of_events << endl;
    for (int i = 1; i < order_max; i++) {
        double vn2_avg = 0.0;
        double vn2_err = 0.0;
        double Qn2_avg = Qn2_vector[i] / total_number_of_events;
        if (Qn2_avg > 0.) {
            vn2_avg = sqrt(Qn2_avg / num_pair);
            double Qn2_stdsq =
                (Qn2_vector_err[i] / total_number_of_events
                 - Qn2_avg * Qn2_avg);
            if (Qn2_stdsq > 0) {
                double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                vn2_err = Qn2_err / num_pair;
            }
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << vn2_avg << "  " << vn2_err << "  " << Qn2_avg << "  "
               << Qn2_vector_err[i] / total_number_of_events << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss;
        ostringstream filename_os;
        if (rap_type == 0) {
            filename_ss << path_ << "/particle_" << particle_monval << "_Cn2_ss"
                        << "_eta_" << rap_min << "_" << rap_max << ".dat";
            filename_os << path_ << "/particle_" << particle_monval << "_Cn2_os"
                        << "_eta_" << rap_min << "_" << rap_max << ".dat";
        } else {
            filename_ss << path_ << "/particle_" << particle_monval << "_Cn2_ss"
                        << "_y_" << rap_min << "_" << rap_max << ".dat";
            filename_os << path_ << "/particle_" << particle_monval << "_Cn2_os"
                        << "_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        output_ss << "# n  vn{2}  vn{2}_err  Cn2_ss  Cn2_ss_err" << endl;
        output_os << "# n  vn{2}  vn{2}_err  Cn2_os  Cn2_os_err" << endl;

        double num_pair_ss = Cn2_ss[0] / total_number_of_events;
        double num_pair_ss_stdsq =
            (Cn2_ss_err[0] / total_number_of_events
             - num_pair_ss * num_pair_ss);
        double num_pair_ss_err = 0.0;
        if (num_pair_ss_stdsq > 0) {
            num_pair_ss_err = sqrt(num_pair_ss_stdsq / total_number_of_events);
        }
        output_ss << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_ss << "  " << num_pair_ss_err << "  "
                  << num_pair_ss << "  "
                  << Cn2_ss_err[0] / total_number_of_events << endl;
        double num_pair_os = Cn2_os[0] / total_number_of_events;
        double num_pair_os_stdsq =
            (Cn2_os_err[0] / total_number_of_events
             - num_pair_os * num_pair_os);
        double num_pair_os_err = 0.0;
        if (num_pair_os_stdsq > 0) {
            num_pair_os_err = sqrt(num_pair_os_stdsq / total_number_of_events);
        }
        output_os << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_os << "  " << num_pair_os_err << "  "
                  << num_pair_os << "  "
                  << Cn2_os_err[0] / total_number_of_events << endl;

        for (int i = 1; i < order_max; i++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Cn2_ss_avg = Cn2_ss[i] / total_number_of_events;
            if (Cn2_ss_avg > 0.) {
                vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                double Cn2_ss_stdsq =
                    (Cn2_ss_err[i] / total_number_of_events
                     - Cn2_ss_avg * Cn2_ss_avg);
                if (Cn2_ss_stdsq > 0) {
                    double Qn2_ss_err =
                        sqrt(Cn2_ss_stdsq / total_number_of_events);
                    vn2_err = Qn2_ss_err / num_pair_ss;
                }
            }
            output_ss << scientific << setw(18) << setprecision(8) << i << "  "
                      << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                      << "  " << Cn2_ss_err[i] / total_number_of_events << endl;

            vn2_avg = 0.0;
            vn2_err = 0.0;
            double Cn2_os_avg = Cn2_os[i] / total_number_of_events;
            if (Cn2_os_avg > 0.) {
                vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                double Cn2_os_stdsq =
                    (Cn2_os_err[i] / total_number_of_events
                     - Cn2_os_avg * Cn2_os_avg);
                if (Cn2_os_stdsq > 0) {
                    double Qn2_os_err =
                        sqrt(Cn2_os_stdsq / total_number_of_events);
                    vn2_err = Qn2_os_err / num_pair_os;
                }
            }
            output_os << scientific << setw(18) << setprecision(8) << i << "  "
                      << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                      << "  " << Cn2_os_err[i] / total_number_of_events << endl;
        }
        output_ss.close();
        output_os.close();
    }
}